

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readComment(OurReader *this)

{
  bool bVar1;
  bool bVar2;
  CommentPlacement local_2c;
  CommentPlacement placement;
  bool isCppStyleComment;
  bool isCStyleComment;
  bool cStyleWithEmbeddedNewline;
  bool successful;
  Location pCStack_20;
  Char c;
  Location commentBegin;
  OurReader *this_local;
  
  pCStack_20 = this->current_ + -1;
  commentBegin = (Location)this;
  placement._3_1_ = getNextChar(this);
  placement._2_1_ = commentBefore >> 0x10;
  placement._1_1_ = commentBefore >> 8;
  placement._0_1_ = placement._3_1_ == 0x2a;
  bVar2 = placement._3_1_ == 0x2f;
  if ((bool)(undefined1)placement) {
    placement._2_1_ = readCStyleComment(this,(bool *)((long)&placement + 1));
  }
  else if (bVar2) {
    placement._2_1_ = readCppStyleComment(this);
  }
  if (placement._2_1_ == commentBefore >> 0x10) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->collectComments_ & 1U) != 0) {
      local_2c = commentBefore;
      if (((((this->lastValueHasAComment_ & 1U) == 0) && (this->lastValueEnd_ != (Location)0x0)) &&
          (bVar1 = containsNewLine(this->lastValueEnd_,pCStack_20), !bVar1)) &&
         ((bVar2 || ((placement._1_1_ & 1) == commentBefore >> 8)))) {
        local_2c = commentAfterOnSameLine;
        this->lastValueHasAComment_ = true;
      }
      addComment(this,pCStack_20,this->current_,local_2c);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool OurReader::readComment() {
  const Location commentBegin = current_ - 1;
  const Char c = getNextChar();
  bool successful = false;
  bool cStyleWithEmbeddedNewline = false;

  const bool isCStyleComment = (c == '*');
  const bool isCppStyleComment = (c == '/');
  if (isCStyleComment) {
    successful = readCStyleComment(&cStyleWithEmbeddedNewline);
  } else if (isCppStyleComment) {
    successful = readCppStyleComment();
  }

  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;

    if (!lastValueHasAComment_) {
      if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
        if (isCppStyleComment || !cStyleWithEmbeddedNewline) {
          placement = commentAfterOnSameLine;
          lastValueHasAComment_ = true;
        }
      }
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}